

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O2

LPCSTR NpyArray::ParseHeaderNPY
                 (FILE *fp,shape_t *shape,size_t *wordSize,char *type,bool *fortranOrder)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char buffer [32];
  string header;
  
  sVar2 = fread(buffer,1,10,(FILE *)fp);
  pcVar4 = "error: invalid header id";
  if ((sVar2 == 10) && (buffer[0] == -0x6d)) {
    iVar1 = bcmp(buffer + 1,"NUMPY",5);
    if (iVar1 == 0) {
      if (buffer[6] < '\x02') {
        sVar2 = (ulong)(ushort)(short)buffer[8] | (ulong)(((int)buffer[9] & 0xffffU) << 8);
      }
      else {
        fread(buffer + 10,1,2,(FILE *)fp);
        sVar2 = (size_t)((int)buffer[8] | (int)buffer[9] << 8 |
                        (int)buffer[10] << 0x10 | (uint)(byte)buffer[0xb] << 0x18);
      }
      header._M_dataplus._M_p = (pointer)&header.field_2;
      std::__cxx11::string::_M_construct((ulong)&header,(char)sVar2);
      sVar3 = fread(header._M_dataplus._M_p,1,sVar2,(FILE *)fp);
      if (sVar3 == sVar2) {
        pcVar4 = ParseHeaderNPY(&header,shape,wordSize,type,fortranOrder);
      }
      else {
        pcVar4 = "error: invalid header";
      }
      std::__cxx11::string::~string((string *)&header);
    }
  }
  return pcVar4;
}

Assistant:

LPCSTR NpyArray::ParseHeaderNPY(FILE* fp, shape_t& shape, size_t& wordSize, char& type, bool& fortranOrder)
{
	char buffer[32];
	if (fread(buffer, sizeof(char), 10, fp) != 10 ||
		buffer[0] != (char)0x93 || _tcsncmp(buffer+1, "NUMPY", 5) != 0)
		return "error: invalid header id";
	// parse the length of the header data
	uint32_t lenHeader;
	ASSERT(buffer[7] >= 0); // minor version number of the file format
	if (buffer[6] > 1) { // major version number of the file format
		// little-endian unsigned int
		fread(buffer+10, sizeof(char), 2, fp);
		lenHeader = (uint32_t(buffer[11])<<24)|(uint32_t(buffer[10])<<16)|(uint32_t(buffer[9])<<8)|uint32_t(buffer[8]);
	} else {
		// little-endian unsigned short int
		lenHeader = (uint16_t(buffer[9])<<8)|uint16_t(buffer[8]);
	}
	std::string header(lenHeader, '\0');
	if (fread(&header[0], sizeof(char), lenHeader, fp) != lenHeader)
		return "error: invalid header";
	return ParseHeaderNPY(header, shape, wordSize, type, fortranOrder);
}